

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mbedtls_mpi_uint mVar5;
  ulong uVar6;
  mbedtls_mpi_uint *pmVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi Z;
  mbedtls_mpi X;
  mbedtls_mpi Y;
  mbedtls_mpi T1;
  mbedtls_mpi Y_1;
  mbedtls_mpi T2;
  ulong local_f8;
  undefined1 local_f0 [16];
  mbedtls_mpi_uint *local_e0;
  undefined8 *puStack_d8;
  mbedtls_mpi local_d0;
  ulong local_b8;
  ulong local_b0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  ulong local_60;
  ulong local_58;
  mbedtls_mpi local_50;
  ulong local_38;
  
  local_78.p = (mbedtls_mpi_uint *)&local_d0;
  local_d0.s = 0;
  local_d0._4_4_ = 0;
  local_78.s = 1;
  local_78.n = 1;
  iVar2 = mbedtls_mpi_cmp_mpi(B,&local_78);
  if (iVar2 == 0) {
    return -0xc;
  }
  local_d0.s = 1;
  local_d0.n = 0;
  local_d0.p = (mbedtls_mpi_uint *)0x0;
  local_a8.s = 1;
  local_a8.n = 0;
  local_a8.p = (mbedtls_mpi_uint *)0x0;
  local_f0._8_4_ = 1;
  local_e0 = (mbedtls_mpi_uint *)0x0;
  puStack_d8 = (undefined8 *)0x0;
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  local_50.s = 1;
  local_50.n = 0;
  local_50.p = (mbedtls_mpi_uint *)0x0;
  iVar2 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar2 < 0) {
    if (Q != (mbedtls_mpi *)0x0) {
      iVar2 = mbedtls_mpi_grow(Q,1);
      if (iVar2 != 0) goto LAB_0012645d;
      memset(Q->p,0,Q->n << 3);
      *Q->p = 0;
      Q->s = 1;
    }
    if (R == (mbedtls_mpi *)0x0) {
      return 0;
    }
    iVar2 = mbedtls_mpi_copy(R,A);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&local_d0,A);
    if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&local_a8,B), iVar2 == 0)) {
      local_a8.s = 1;
      local_d0.s = 1;
      iVar2 = mbedtls_mpi_grow((mbedtls_mpi *)(local_f0 + 8),A->n + 2);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_grow((mbedtls_mpi *)(local_f0 + 8),1), iVar2 == 0)) {
        memset(puStack_d8,0,(long)local_e0 << 3);
        *puStack_d8 = 0;
        local_f0._8_4_ = 1;
        iVar2 = mbedtls_mpi_grow(&local_90,2);
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_grow(&local_50,3), iVar2 == 0)) {
          sVar4 = mbedtls_mpi_bitlen(&local_a8);
          uVar6 = (ulong)((uint)sVar4 & 0x3f);
          if (uVar6 == 0x3f) {
            uVar6 = 0;
          }
          else {
            uVar6 = uVar6 ^ 0x3f;
            iVar2 = mbedtls_mpi_shift_l(&local_d0,uVar6);
            if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_a8,uVar6), iVar2 != 0))
            goto LAB_0012645d;
          }
          sVar4 = local_d0.n;
          local_f8 = local_d0.n;
          local_b8 = local_a8.n;
          local_b0 = local_d0.n - local_a8.n;
          local_58 = local_b0 * 0x40;
          iVar2 = mbedtls_mpi_shift_l(&local_a8,local_58);
          if (iVar2 == 0) {
            local_60 = local_b8 - 1;
            local_38 = uVar6;
            do {
              iVar2 = mbedtls_mpi_cmp_mpi(&local_d0,&local_a8);
              if (iVar2 < 0) {
                iVar2 = mbedtls_mpi_shift_r(&local_a8,local_58);
                if (iVar2 == 0) {
                  uVar6 = sVar4 - 1;
                  if (uVar6 <= local_60) goto LAB_001268e4;
                  local_58 = ~local_b8;
                  goto LAB_00126620;
                }
                break;
              }
              puStack_d8[local_b0] = puStack_d8[local_b0] + 1;
              iVar2 = mbedtls_mpi_sub_mpi(&local_d0,&local_d0,&local_a8);
            } while (iVar2 == 0);
          }
        }
      }
    }
  }
  goto LAB_0012645d;
  while( true ) {
    iVar2 = mbedtls_mpi_shift_l(&local_90,lVar1 * 0x40);
    if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_sub_mpi(&local_d0,&local_d0,&local_90), iVar2 != 0))
    goto LAB_0012645d;
    local_f0._0_8_ = 0;
    local_78.s = 1;
    local_78.n = 1;
    local_78.p = (mbedtls_mpi_uint *)local_f0;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_d0,&local_78);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&local_90,&local_a8);
      if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&local_90,lVar1 * 0x40), iVar2 != 0)) ||
         (iVar2 = mbedtls_mpi_add_mpi(&local_d0,&local_d0,&local_90), iVar2 != 0))
      goto LAB_0012645d;
      puStack_d8[lVar1] = puStack_d8[lVar1] + -1;
    }
    local_f8 = local_b0;
    uVar6 = local_b0 - 1;
    if (uVar6 <= local_60) break;
LAB_00126620:
    uVar8 = 0xffffffffffffffff;
    local_b0 = uVar6;
    if (local_d0.p[uVar6] < local_a8.p[local_b8 - 1]) {
      auVar10 = __udivti3(local_d0.p[local_f8 - 2],local_d0.p[uVar6],local_a8.p[local_b8 - 1],0);
      uVar8 = -(ulong)(auVar10._8_8_ != 0) | auVar10._0_8_;
    }
    puStack_d8[local_f8 + local_58] = uVar8;
    lVar1 = local_f8 + local_58;
    puStack_d8[lVar1] = puStack_d8[lVar1] + 1;
    do {
      puStack_d8[lVar1] = puStack_d8[lVar1] + -1;
      iVar2 = mbedtls_mpi_lset(&local_90,0);
      if (iVar2 != 0) goto LAB_0012645d;
      if (local_60 == 0) {
        mVar5 = 0;
      }
      else {
        mVar5 = local_a8.p[local_b8 - 2];
      }
      *local_90.p = mVar5;
      local_90.p[1] = local_a8.p[local_b8 - 1];
      local_f0._0_8_ = puStack_d8[lVar1];
      local_78.s = 1;
      local_78.n = 1;
      local_78.p = (mbedtls_mpi_uint *)local_f0;
      iVar2 = mbedtls_mpi_mul_mpi(&local_90,&local_90,&local_78);
      if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_lset(&local_50,0), iVar2 != 0)) goto LAB_0012645d;
      if (local_b0 < 2) {
        mVar5 = 0;
      }
      else {
        mVar5 = local_d0.p[local_f8 - 3];
      }
      *local_50.p = mVar5;
      local_50.p[1] = local_d0.p[local_f8 - 2];
      local_50.p[2] = local_d0.p[local_b0];
      iVar2 = mbedtls_mpi_cmp_mpi(&local_90,&local_50);
    } while (0 < iVar2);
    local_f0._0_8_ = puStack_d8[lVar1];
    local_78.s = 1;
    local_78.n = 1;
    local_78.p = (mbedtls_mpi_uint *)local_f0;
    iVar2 = mbedtls_mpi_mul_mpi(&local_90,&local_a8,&local_78);
    if (iVar2 != 0) goto LAB_0012645d;
  }
LAB_001268e4:
  if (Q != (mbedtls_mpi *)0x0) {
    iVar2 = mbedtls_mpi_copy(Q,(mbedtls_mpi *)(local_f0 + 8));
    if (iVar2 != 0) goto LAB_0012645d;
    Q->s = B->s * A->s;
  }
  iVar9 = 0;
  iVar2 = iVar9;
  if ((R != (mbedtls_mpi *)0x0) && (iVar2 = mbedtls_mpi_shift_r(&local_d0,local_38), iVar2 == 0)) {
    local_d0.s = A->s;
    iVar2 = mbedtls_mpi_copy(R,&local_d0);
    if (iVar2 == 0) {
      local_78.p = (mbedtls_mpi_uint *)local_f0;
      local_f0._0_8_ = 0;
      local_78.s = 1;
      local_78.n = 1;
      iVar3 = mbedtls_mpi_cmp_mpi(R,&local_78);
      iVar2 = iVar9;
      if (iVar3 == 0) {
        R->s = 1;
      }
    }
  }
LAB_0012645d:
  if (local_d0.p != (mbedtls_mpi_uint *)0x0) {
    if (local_d0.n != 0) {
      uVar6 = 0;
      do {
        local_d0.p[uVar6] = 0;
        uVar6 = uVar6 + 1;
      } while (local_d0.n != uVar6);
    }
    free(local_d0.p);
  }
  local_d0.s = 1;
  local_d0.n = 0;
  local_d0.p = (mbedtls_mpi_uint *)0x0;
  if (local_a8.p != (mbedtls_mpi_uint *)0x0) {
    if (local_a8.n != 0) {
      uVar6 = 0;
      do {
        local_a8.p[uVar6] = 0;
        uVar6 = uVar6 + 1;
      } while (local_a8.n != uVar6);
    }
    free(local_a8.p);
  }
  local_a8.s = 1;
  local_a8.n = 0;
  local_a8.p = (mbedtls_mpi_uint *)0x0;
  if (puStack_d8 != (undefined8 *)0x0) {
    if (local_e0 != (mbedtls_mpi_uint *)0x0) {
      pmVar7 = (mbedtls_mpi_uint *)0x0;
      do {
        puStack_d8[(long)pmVar7] = 0;
        pmVar7 = (mbedtls_mpi_uint *)((long)pmVar7 + 1);
      } while (local_e0 != pmVar7);
    }
    free(puStack_d8);
  }
  local_f0._8_4_ = 1;
  local_e0 = (mbedtls_mpi_uint *)0x0;
  puStack_d8 = (undefined8 *)0x0;
  if (local_90.p != (mbedtls_mpi_uint *)0x0) {
    if (local_90.n != 0) {
      sVar4 = 0;
      do {
        local_90.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_90.n != sVar4);
    }
    free(local_90.p);
  }
  local_90.s = 1;
  local_90.n = 0;
  local_90.p = (mbedtls_mpi_uint *)0x0;
  if (local_50.p != (mbedtls_mpi_uint *)0x0) {
    if (local_50.n != 0) {
      sVar4 = 0;
      do {
        local_50.p[sVar4] = 0;
        sVar4 = sVar4 + 1;
      } while (local_50.n != sVar4);
    }
    free(local_50.p);
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_div_mpi( mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;

    if( mbedtls_mpi_cmp_int( B, 0 ) == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );
    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 );

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
    {
        if( Q != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_lset( Q, 0 ) );
        if( R != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, A ) );
        return( 0 );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &X, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, B ) );
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &Z, A->n + 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Z,  0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T1, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T2, 3 ) );

    k = mbedtls_mpi_bitlen( &Y ) % biL;
    if( k < biL - 1 )
    {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &X, k ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, k ) );
    }
    else k = 0;

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, biL * ( n - t ) ) );

    while( mbedtls_mpi_cmp_mpi( &X, &Y ) >= 0 )
    {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &Y ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, biL * ( n - t ) ) );

    for( i = n; i > t ; i-- )
    {
        if( X.p[i] >= Y.p[t] )
            Z.p[i - t - 1] = ~0;
        else
        {
            Z.p[i - t - 1] = mbedtls_int_div_int( X.p[i], X.p[i - 1],
                                                            Y.p[t], NULL);
        }

        Z.p[i - t - 1]++;
        do
        {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T1, 0 ) );
            T1.p[0] = ( t < 1 ) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &T1, Z.p[i - t - 1] ) );

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T2, 0 ) );
            T2.p[0] = ( i < 2 ) ? 0 : X.p[i - 2];
            T2.p[1] = ( i < 1 ) ? 0 : X.p[i - 1];
            T2.p[2] = X.p[i];
        }
        while( mbedtls_mpi_cmp_mpi( &T1, &T2 ) > 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &Y, Z.p[i - t - 1] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1,  biL * ( i - t - 1 ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &T1 ) );

        if( mbedtls_mpi_cmp_int( &X, 0 ) < 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &Y ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1, biL * ( i - t - 1 ) ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &X, &X, &T1 ) );
            Z.p[i - t - 1]--;
        }
    }

    if( Q != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( Q, &Z ) );
        Q->s = A->s * B->s;
    }

    if( R != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &X, k ) );
        X.s = A->s;
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, &X ) );

        if( mbedtls_mpi_cmp_int( R, 0 ) == 0 )
            R->s = 1;
    }

cleanup:

    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );
    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 );

    return( ret );
}